

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  Flags FVar1;
  pointer ppMVar2;
  pointer ppMVar3;
  MatcherDescriberInterface *pMVar4;
  ostream *poVar5;
  char *pcVar6;
  size_t i;
  long lVar7;
  long *local_40;
  Message local_38;
  
  FVar1 = this->match_flags_;
  if (FVar1 == Superset) {
    pcVar6 = "no surjection from elements to requirements exists such that:\n";
  }
  else {
    if (FVar1 != Subset) {
      if (FVar1 == ExactMatch) {
        ppMVar2 = (this->matcher_describers_).
                  super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppMVar3 = (this->matcher_describers_).
                  super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppMVar2 == ppMVar3) {
          std::operator<<(os,"isn\'t empty");
          return;
        }
        poVar5 = std::operator<<(os,"doesn\'t have ");
        if ((long)ppMVar3 - (long)ppMVar2 == 8) {
          Elements((UnorderedElementsAreMatcherImplBase *)&local_40,1);
          poVar5 = testing::operator<<(poVar5,(Message *)&local_40);
          poVar5 = std::operator<<(poVar5,", or has ");
          Elements((UnorderedElementsAreMatcherImplBase *)&local_38,1);
          poVar5 = testing::operator<<(poVar5,&local_38);
          std::operator<<(poVar5," that ");
          if (local_38.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
              (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )0x0) {
            (*(code *)(*(MatcherDescriberInterface **)
                        local_38.ss_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl)[1]._vptr_MatcherDescriberInterface)();
          }
          if (local_40 != (long *)0x0) {
            (**(code **)(*local_40 + 8))();
          }
          pMVar4 = *(this->matcher_describers_).
                    super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          (*pMVar4->_vptr_MatcherDescriberInterface[3])(pMVar4,os);
          return;
        }
        Elements((UnorderedElementsAreMatcherImplBase *)&local_40,
                 (long)(this->matcher_describers_).
                       super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->matcher_describers_).
                       super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
        poVar5 = testing::operator<<(poVar5,(Message *)&local_40);
        std::operator<<(poVar5,", or there exists no permutation of elements such that:\n");
        if (local_40 != (long *)0x0) {
          (**(code **)(*local_40 + 8))();
        }
      }
      goto LAB_0015fbac;
    }
    pcVar6 = "no injection from elements to requirements exists such that:\n";
  }
  std::operator<<(os,pcVar6);
LAB_0015fbac:
  pcVar6 = "";
  for (lVar7 = 0;
      lVar7 != (long)(this->matcher_describers_).
                     super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->matcher_describers_).
                     super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3; lVar7 = lVar7 + 1) {
    std::operator<<(os,pcVar6);
    if (this->match_flags_ == ExactMatch) {
      poVar5 = std::operator<<(os," - element #");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      pcVar6 = " ";
    }
    else {
      pcVar6 = " - an element ";
      poVar5 = os;
    }
    std::operator<<(poVar5,pcVar6);
    pMVar4 = (this->matcher_describers_).
             super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar7];
    (*pMVar4->_vptr_MatcherDescriberInterface[2])(pMVar4,os);
    pcVar6 = "\n";
    if (this->match_flags_ == ExactMatch) {
      pcVar6 = ", and\n";
    }
  }
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl(
    ::std::ostream* os) const {
  switch (match_flags()) {
    case UnorderedMatcherRequire::ExactMatch:
      if (matcher_describers_.empty()) {
        *os << "isn't empty";
        return;
      }
      if (matcher_describers_.size() == 1) {
        *os << "doesn't have " << Elements(1) << ", or has " << Elements(1)
            << " that ";
        matcher_describers_[0]->DescribeNegationTo(os);
        return;
      }
      *os << "doesn't have " << Elements(matcher_describers_.size())
          << ", or there exists no permutation of elements such that:\n";
      break;
    case UnorderedMatcherRequire::Superset:
      *os << "no surjection from elements to requirements exists such that:\n";
      break;
    case UnorderedMatcherRequire::Subset:
      *os << "no injection from elements to requirements exists such that:\n";
      break;
  }
  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep;
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      *os << " - element #" << i << " ";
    } else {
      *os << " - an element ";
    }
    matcher_describers_[i]->DescribeTo(os);
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      sep = ", and\n";
    } else {
      sep = "\n";
    }
  }
}